

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::Option::Option
          (Option *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  string *arg_help_local;
  shared_ptr<const_cxxopts::Value> *value_local;
  string *desc_local;
  string *opts_local;
  Option *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)opts);
  std::__cxx11::string::string((string *)&this->desc_,(string *)desc);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr(&this->value_,value);
  std::__cxx11::string::string((string *)&this->arg_help_,(string *)arg_help);
  return;
}

Assistant:

Option
    (
      std::string opts,
      std::string desc,
      std::shared_ptr<const Value>  value = ::cxxopts::value<bool>(),
      std::string arg_help = ""
    )
    : opts_(std::move(opts))
    , desc_(std::move(desc))
    , value_(std::move(value))
    , arg_help_(std::move(arg_help))
    {
    }